

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string_suite::fail_escape(void)

{
  char input [4];
  decoder_type decoder;
  undefined4 local_14c;
  value local_148;
  value_type local_144 [4];
  basic_decoder<char> local_140;
  
  builtin_memcpy(local_144,"\"\\\"",4);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<4ul>(&local_140,&local_144);
  local_148 = local_140.current.code;
  local_14c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6ea,"void string_suite::fail_escape()",&local_148,&local_14c);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[4]>
            ("decoder.literal()","\"\\\"\\\\\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6eb,"void string_suite::fail_escape()",&local_140.current.view,"\"\\\"");
  return;
}

Assistant:

void fail_escape()
{
    const char input[] = "\"\\\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\\\"");
}